

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O0

Value * EncodeFilename(Value *__return_storage_ptr__,string *path)

{
  bool bVar1;
  int iVar2;
  char local_6d [5];
  reference pcStack_68;
  char buf [5];
  char *byte;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  undefined1 local_38 [8];
  string data;
  string *path_local;
  
  data.field_2._8_8_ = path;
  std::__cxx11::string::string((string *)local_38);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)local_38);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  byte = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&byte), bVar1) {
    pcStack_68 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1);
    iVar2 = iscntrl((int)*pcStack_68);
    if (iVar2 == 0) {
      if ((*pcStack_68 == '\"') || (*pcStack_68 == '\\')) {
        std::__cxx11::string::push_back((char)local_38);
        std::__cxx11::string::push_back((char)local_38);
      }
      else {
        std::__cxx11::string::push_back((char)local_38);
      }
    }
    else {
      std::__cxx11::string::append(local_38);
      snprintf(local_6d,5,"%04x",(ulong)(uint)(int)*pcStack_68);
      std::__cxx11::string::append(local_38);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  Json::Value::Value(__return_storage_ptr__,(String *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static Json::Value EncodeFilename(std::string const& path)
{
  std::string data;
  data.reserve(path.size());

  for (auto const& byte : path) {
    if (std::iscntrl(byte)) {
      // Control characters.
      data.append("\\u");
      char buf[5];
      std::snprintf(buf, sizeof(buf), "%04x", byte);
      data.append(buf);
    } else if (byte == '"' || byte == '\\') {
      // Special JSON characters.
      data.push_back('\\');
      data.push_back(byte);
    } else {
      // Other data.
      data.push_back(byte);
    }
  }

  return data;
}